

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::insert
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QXdgDBusImageStruct **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_80;
  undefined1 *local_58;
  QArrayDataPointer<char> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QStack_50.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QXdgDBusImageStruct::QXdgDBusImageStruct((QXdgDBusImageStruct *)&local_58,t);
  bVar3 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
          super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar3),n,
             (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QXdgDBusImageStruct::QXdgDBusImageStruct
                ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + -1,
                 (QXdgDBusImageStruct *)&local_58);
      ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                super_QArrayDataPointer<QXdgDBusImageStruct>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QXdgDBusImageStruct> *)this,i,n);
    Inserter::insertFill(&local_80,(QXdgDBusImageStruct *)&local_58,n);
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }